

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Response.cpp
# Opt level: O0

void __thiscall MNS::Response::Response(Response *this,SocketData *socketData)

{
  void *pvVar1;
  undefined8 in_RSI;
  undefined1 *in_RDI;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x11ee10);
  *in_RDI = 0;
  *(undefined8 *)(in_RDI + 0x58) = in_RSI;
  *(undefined4 *)(in_RDI + 4) = 200;
  *(undefined4 *)(in_RDI + 0x10) = 0;
  pvVar1 = malloc(0x1000);
  *(void **)(in_RDI + 0x18) = pvVar1;
  pvVar1 = malloc(0x1000);
  *(void **)(in_RDI + 0x20) = pvVar1;
  *(undefined4 *)(in_RDI + 0x14) = 0x1000;
  in_RDI[1] = 0;
  in_RDI[2] = 1;
  *(undefined8 *)(in_RDI + 8) = 0;
  return;
}

Assistant:

MNS::Response::Response(const MNS::SocketData *socketData) {
	this->finished = false;
	this->socketData = socketData;

	this->statusCode = 200;

	this->bufferLen = 0;
	this->buffer = (char *)malloc(4096);
	this->responseBuffer = (char *)malloc(4096);
	this->bufferSize = 4096;
	this->headersSent = false;
	this->sendDate = true;
	this->statusMessage = NULL;
	//this->response.reserve(1024);
}